

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxu32 SyStrlen(char *zSrc)

{
  char *pcVar1;
  int iVar2;
  char *zIn;
  
  iVar2 = (int)zSrc;
  if (*zSrc != '\0') {
    pcVar1 = zSrc + 2;
    do {
      zSrc = pcVar1;
      if (zSrc[-1] == '\0') {
        zSrc = zSrc + -1;
        goto LAB_0010c5e9;
      }
      if (*zSrc == '\0') goto LAB_0010c5e9;
      if (zSrc[1] == '\0') {
        zSrc = zSrc + 1;
        goto LAB_0010c5e9;
      }
      pcVar1 = zSrc + 4;
    } while (zSrc[2] != '\0');
    zSrc = zSrc + 2;
  }
LAB_0010c5e9:
  return (int)zSrc - iVar2;
}

Assistant:

JX9_PRIVATE sxu32 SyStrlen(const char *zSrc)
{
	register const char *zIn = zSrc;
#if defined(UNTRUST)
	if( zIn == 0 ){
		return 0;
	}
#endif
	for(;;){
		if( !zIn[0] ){ break; } zIn++;
		if( !zIn[0] ){ break; } zIn++;
		if( !zIn[0] ){ break; } zIn++;
		if( !zIn[0] ){ break; } zIn++;	
	}
	return (sxu32)(zIn - zSrc);
}